

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuGitter.cpp
# Opt level: O2

vector<std::vector<cell_*,_std::allocator<cell_*>_>,_std::allocator<std::vector<cell_*,_std::allocator<cell_*>_>_>_>
* __thiscall
SudokuGitter::getQuad
          (vector<std::vector<cell_*,_std::allocator<cell_*>_>,_std::allocator<std::vector<cell_*,_std::allocator<cell_*>_>_>_>
           *__return_storage_ptr__,SudokuGitter *this,uint hoehenIndex,uint breitenInxted)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int widthIndex;
  ulong uVar4;
  ulong uVar5;
  _Vector_base<cell_*,_std::allocator<cell_*>_> local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<cell_*,_std::allocator<cell_*>_>,_std::allocator<std::vector<cell_*,_std::allocator<cell_*>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<cell_*,_std::allocator<cell_*>_>,_std::allocator<std::vector<cell_*,_std::allocator<cell_*>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<cell_*,_std::allocator<cell_*>_>,_std::allocator<std::vector<cell_*,_std::allocator<cell_*>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar2 = this->quadHeight;
  iVar3 = hoehenIndex * uVar2;
  uVar1 = this->quadWidth;
  for (uVar5 = 0; uVar5 < uVar2; uVar5 = uVar5 + 1) {
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<cell*,std::allocator<cell*>>,std::allocator<std::vector<cell*,std::allocator<cell*>>>>
    ::emplace_back<std::vector<cell*,std::allocator<cell*>>>
              ((vector<std::vector<cell*,std::allocator<cell*>>,std::allocator<std::vector<cell*,std::allocator<cell*>>>>
                *)__return_storage_ptr__,(vector<cell_*,_std::allocator<cell_*>_> *)&local_48);
    std::_Vector_base<cell_*,_std::allocator<cell_*>_>::~_Vector_base(&local_48);
    for (uVar4 = 0; uVar4 < this->quadWidth; uVar4 = uVar4 + 1) {
      local_48._M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)(breitenInxted * uVar1 + (int)uVar4) * 8 +
                    *(long *)&(this->cells).
                              super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[(uint)(iVar3 + (int)uVar5)].
                              super__Vector_base<cell,_std::allocator<cell>_>._M_impl);
      std::vector<cell*,std::allocator<cell*>>::emplace_back<cell*>
                ((vector<cell*,std::allocator<cell*>> *)
                 ((__return_storage_ptr__->
                  super__Vector_base<std::vector<cell_*,_std::allocator<cell_*>_>,_std::allocator<std::vector<cell_*,_std::allocator<cell_*>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + uVar5),(cell **)&local_48);
    }
    uVar2 = this->quadHeight;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<vector<cell *>> SudokuGitter::getQuad(unsigned int hoehenIndex, unsigned int breitenInxted) {
    vector<vector<cell *>> result = vector<vector<cell *>>();

    unsigned int startHeightIndex = quadHeight * hoehenIndex;
    unsigned int startWidthIndex = quadWidth * breitenInxted;

    for (int heightIndex = 0; heightIndex < quadHeight; heightIndex++) {
        result.push_back(vector<cell *>());
        for (int widthIndex = 0; widthIndex < quadWidth; widthIndex++) {
            result[heightIndex].push_back(&cells[heightIndex + startHeightIndex][widthIndex + startWidthIndex]);
        }
    }

    return result;
}